

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::Track::set_name(Track *this,char *name)

{
  size_t sVar1;
  char *__dest;
  
  if (name != (char *)0x0) {
    if (this->name_ != (char *)0x0) {
      operator_delete__(this->name_);
    }
    sVar1 = strlen(name);
    __dest = (char *)operator_new__(sVar1 + 1,(nothrow_t *)&std::nothrow);
    this->name_ = __dest;
    if (__dest != (char *)0x0) {
      strcpy(__dest,name);
      return;
    }
  }
  return;
}

Assistant:

void Track::set_name(const char* name) {
  if (name) {
    delete[] name_;

    const size_t length = strlen(name) + 1;
    name_ = new (std::nothrow) char[length];  // NOLINT
    if (name_) {
#ifdef _MSC_VER
      strcpy_s(name_, length, name);
#else
      strcpy(name_, name);
#endif
    }
  }
}